

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall Noise::Noise(Noise *this,Noise *noise)

{
  Time *time;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Noise *local_18;
  Noise *noise_local;
  Noise *this_local;
  
  time = (noise->super_StochasticVariable).super_StochasticProcess.super_TimeDependent.xTime;
  local_18 = noise;
  noise_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Stochastic Variable",&local_71);
  StochasticVariable::StochasticVariable(&this->super_StochasticVariable,time,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__Noise_0018fe78;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Noise_0018ff28;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Noise_0018ff70;
  return;
}

Assistant:

Noise::Noise( const Noise &noise)
	: StochasticVariable(noise.xTime)
{}